

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O0

int WebPPictureAllocARGB(WebPPicture *picture,int width,int height)

{
  void *pvVar1;
  int in_EDX;
  int in_ESI;
  WebPPicture *in_RDI;
  uint64_t argb_size;
  void *memory;
  size_t in_stack_ffffffffffffffe0;
  int local_4;
  
  WebPSafeFree((void *)0x1568c4);
  WebPPictureResetBufferARGB(in_RDI);
  if ((in_ESI < 1) || (in_EDX < 1)) {
    local_4 = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_BAD_DIMENSION);
  }
  else {
    pvVar1 = WebPSafeMalloc(CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffe0);
    if (pvVar1 == (void *)0x0) {
      local_4 = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
    else {
      in_RDI->memory_argb_ = pvVar1;
      in_RDI->argb = (uint32_t *)((long)pvVar1 + 0x1fU & 0xffffffffffffffe0);
      in_RDI->argb_stride = in_ESI;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int WebPPictureAllocARGB(WebPPicture* const picture, int width, int height) {
  void* memory;
  const uint64_t argb_size = (uint64_t)width * height;

  assert(picture != NULL);

  WebPSafeFree(picture->memory_argb_);
  WebPPictureResetBufferARGB(picture);

  if (width <= 0 || height <= 0) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
  }
  // allocate a new buffer.
  memory = WebPSafeMalloc(argb_size + WEBP_ALIGN_CST, sizeof(*picture->argb));
  if (memory == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  picture->memory_argb_ = memory;
  picture->argb = (uint32_t*)WEBP_ALIGN(memory);
  picture->argb_stride = width;
  return 1;
}